

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O0

string * __thiscall
t_py_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_py_generator *this,t_type *type,t_const_value *value)

{
  char *pcVar1;
  __type _Var2;
  bool bVar3;
  uint uVar4;
  t_const_value_type tVar5;
  int iVar6;
  t_struct *this_00;
  int64_t iVar7;
  reference pptVar8;
  string *__lhs;
  undefined4 extraout_var;
  t_type *ptVar9;
  t_type *type_00;
  pointer ppVar10;
  ostream *poVar11;
  reference pptVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined4 extraout_var_00;
  double value_00;
  undefined1 auVar14 [12];
  string local_400;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3e0;
  t_const_value **local_3d8;
  __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
  local_3d0;
  const_iterator v_iter_2;
  vector<t_const_value_*,_std::allocator<t_const_value_*>_> *val_2;
  t_type *etype;
  string local_398;
  _Self local_378;
  _Base_ptr local_370;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_368;
  const_iterator v_iter_1;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val_1;
  t_type *vtype;
  t_type *ktype;
  string local_328;
  undefined1 local_301;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string local_2a0;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_280
  ;
  t_field **local_278;
  t_type *local_270;
  t_type *field_type;
  _Base_ptr local_260;
  _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_> local_258;
  const_iterator v_iter;
  map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
  *val;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  undefined1 local_211;
  string local_210;
  string local_1f0;
  string local_1d0;
  t_base local_1b0;
  t_base tbase;
  undefined1 local_1a0 [8];
  ostringstream out;
  t_const_value *value_local;
  t_type *type_local;
  t_py_generator *this_local;
  
  out._368_8_ = value;
  this_00 = (t_struct *)t_generator::get_true_type(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar4 & 1) == 0) {
    uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[10])();
    if ((uVar4 & 1) == 0) {
      uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
      if (((uVar4 & 1) == 0) &&
         (uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar4 & 1) == 0)) {
        uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if ((uVar4 & 1) == 0) {
          uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
          if (((uVar4 & 1) == 0) &&
             (uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])(), (uVar4 & 1) == 0))
          {
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar6 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
            std::operator+(pbVar13,"CANNOT GENERATE CONSTANT FOR TYPE: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar6));
            __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])();
          if ((uVar4 & 1) == 0) {
            val_2 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                    t_set::get_elem_type((t_set *)this_00);
          }
          else {
            val_2 = (vector<t_const_value_*,_std::allocator<t_const_value_*>_> *)
                    t_list::get_elem_type((t_list *)this_00);
          }
          uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])();
          if ((uVar4 & 1) != 0) {
            bVar3 = is_immutable((t_type *)this_00);
            if (bVar3) {
              std::operator<<((ostream *)local_1a0,"frozen");
            }
            std::operator<<((ostream *)local_1a0,"set(");
          }
          bVar3 = is_immutable((t_type *)this_00);
          if ((bVar3) ||
             (uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])(), (uVar4 & 1) != 0))
          {
            poVar11 = std::operator<<((ostream *)local_1a0,"(");
            std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
          }
          else {
            poVar11 = std::operator<<((ostream *)local_1a0,"[");
            std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
          }
          t_generator::indent_up(&this->super_t_generator);
          v_iter_2._M_current =
               (t_const_value **)t_const_value::get_list((t_const_value *)out._368_8_);
          __gnu_cxx::
          __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
          ::__normal_iterator(&local_3d0);
          local_3d8 = (t_const_value **)
                      std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::begin
                                (v_iter_2._M_current);
          local_3d0._M_current = local_3d8;
          while( true ) {
            local_3e0._M_current =
                 (t_const_value **)
                 std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>::end
                           (v_iter_2._M_current);
            bVar3 = __gnu_cxx::operator!=(&local_3d0,&local_3e0);
            if (!bVar3) break;
            poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
            pptVar12 = __gnu_cxx::
                       __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
                       ::operator*(&local_3d0);
            render_const_value_abi_cxx11_(&local_400,this,(t_type *)val_2,*pptVar12);
            poVar11 = std::operator<<(poVar11,(string *)&local_400);
            poVar11 = std::operator<<(poVar11,",");
            std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_400);
            __gnu_cxx::
            __normal_iterator<t_const_value_*const_*,_std::vector<t_const_value_*,_std::allocator<t_const_value_*>_>_>
            ::operator++(&local_3d0);
          }
          t_generator::indent_down(&this->super_t_generator);
          bVar3 = is_immutable((t_type *)this_00);
          if ((bVar3) ||
             (uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])(), (uVar4 & 1) != 0))
          {
            poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
            std::operator<<(poVar11,")");
          }
          else {
            poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
            std::operator<<(poVar11,"]");
          }
          uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])();
          if ((uVar4 & 1) != 0) {
            std::operator<<((ostream *)local_1a0,")");
          }
        }
        else {
          ptVar9 = t_map::get_key_type((t_map *)this_00);
          type_00 = t_map::get_val_type((t_map *)this_00);
          bVar3 = is_immutable((t_type *)this_00);
          if (bVar3) {
            std::operator<<((ostream *)local_1a0,"TFrozenDict(");
          }
          poVar11 = std::operator<<((ostream *)local_1a0,"{");
          std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
          t_generator::indent_up(&this->super_t_generator);
          v_iter_1._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)out._368_8_);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          _Rb_tree_const_iterator(&local_368);
          local_370 = (_Base_ptr)
                      std::
                      map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                      ::begin(v_iter_1._M_node);
          local_368._M_node = local_370;
          while( true ) {
            local_378._M_node =
                 (_Base_ptr)
                 std::
                 map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 ::end(v_iter_1._M_node);
            bVar3 = std::operator!=(&local_368,&local_378);
            if (!bVar3) break;
            poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_368);
            render_const_value_abi_cxx11_(&local_398,this,ptVar9,ppVar10->first);
            poVar11 = std::operator<<(poVar11,(string *)&local_398);
            poVar11 = std::operator<<(poVar11,": ");
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_368);
            render_const_value_abi_cxx11_((string *)&etype,this,type_00,ppVar10->second);
            poVar11 = std::operator<<(poVar11,(string *)&etype);
            poVar11 = std::operator<<(poVar11,",");
            std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&etype);
            std::__cxx11::string::~string((string *)&local_398);
            std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
            operator++(&local_368);
          }
          t_generator::indent_down(&this->super_t_generator);
          poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
          std::operator<<(poVar11,"}");
          bVar3 = is_immutable((t_type *)this_00);
          if (bVar3) {
            std::operator<<((ostream *)local_1a0,")");
          }
        }
      }
      else {
        type_name_abi_cxx11_((string *)&fields,this,(t_type *)this_00);
        poVar11 = std::operator<<((ostream *)local_1a0,(string *)&fields);
        poVar11 = std::operator<<(poVar11,"(**{");
        std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&fields);
        t_generator::indent_up(&this->super_t_generator);
        f_iter._M_current = (t_field **)t_struct::get_members(this_00);
        __gnu_cxx::
        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
        __normal_iterator((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                           *)&val);
        v_iter._M_node = (_Base_ptr)t_const_value::get_map((t_const_value *)out._368_8_);
        std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
        _Rb_tree_const_iterator(&local_258);
        local_260 = (_Base_ptr)
                    std::
                    map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                    ::begin(v_iter._M_node);
        local_258._M_node = local_260;
        while( true ) {
          field_type = (t_type *)
                       std::
                       map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                       ::end((map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                              *)v_iter._M_node);
          bVar3 = std::operator!=(&local_258,(_Self *)&field_type);
          if (!bVar3) break;
          local_270 = (t_type *)0x0;
          local_278 = (t_field **)
                      std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
          val = (map<t_const_value_*,_t_const_value_*,_t_const_value::value_compare,_std::allocator<std::pair<t_const_value_*const,_t_const_value_*>_>_>
                 *)local_278;
          while( true ) {
            local_280._M_current =
                 (t_field **)
                 std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
            bVar3 = __gnu_cxx::operator!=
                              ((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                *)&val,&local_280);
            if (!bVar3) break;
            pptVar8 = __gnu_cxx::
                      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                      ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                   *)&val);
            __lhs = t_field::get_name_abi_cxx11_(*pptVar8);
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_258);
            t_const_value::get_string_abi_cxx11_(&local_2a0,ppVar10->first);
            _Var2 = std::operator==(__lhs,&local_2a0);
            std::__cxx11::string::~string((string *)&local_2a0);
            if (_Var2) {
              pptVar8 = __gnu_cxx::
                        __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        ::operator*((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                                     *)&val);
              local_270 = t_field::get_type(*pptVar8);
            }
            __gnu_cxx::
            __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
            ::operator++((__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&val);
          }
          if (local_270 == (t_type *)0x0) {
            local_301 = 1;
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar6 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
            std::operator+(&local_2e0,"type error: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var,iVar6));
            std::operator+(&local_2c0,&local_2e0," has no field ");
            ppVar10 = std::
                      _Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
                      operator->(&local_258);
            t_const_value::get_string_abi_cxx11_(&local_300,ppVar10->first);
            std::operator+(pbVar13,&local_2c0,&local_300);
            local_301 = 0;
            __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
          ptVar9 = g_type_string;
          ppVar10 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                    ::operator->(&local_258);
          render_const_value_abi_cxx11_(&local_328,this,ptVar9,ppVar10->first);
          poVar11 = std::operator<<(poVar11,(string *)&local_328);
          poVar11 = std::operator<<(poVar11,": ");
          ptVar9 = local_270;
          ppVar10 = std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>
                    ::operator->(&local_258);
          render_const_value_abi_cxx11_((string *)&ktype,this,ptVar9,ppVar10->second);
          poVar11 = std::operator<<(poVar11,(string *)&ktype);
          poVar11 = std::operator<<(poVar11,",");
          std::operator<<(poVar11,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&ktype);
          std::__cxx11::string::~string((string *)&local_328);
          std::_Rb_tree_const_iterator<std::pair<t_const_value_*const,_t_const_value_*>_>::
          operator++(&local_258);
        }
        t_generator::indent_down(&this->super_t_generator);
        poVar11 = t_generator::indent(&this->super_t_generator,(ostream *)local_1a0);
        std::operator<<(poVar11,"})");
      }
    }
    else {
      iVar7 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(local_1a0,iVar7);
    }
  }
  else {
    local_1b0 = t_base_type::get_base((t_base_type *)this_00);
    switch(local_1b0) {
    case TYPE_STRING:
      uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[7])();
      if ((uVar4 & 1) != 0) {
        std::operator<<((ostream *)local_1a0,'b');
      }
      poVar11 = std::operator<<((ostream *)local_1a0,'\"');
      t_generator::get_escaped_string_abi_cxx11_
                (&local_1d0,&this->super_t_generator,(t_const_value *)out._368_8_);
      poVar11 = std::operator<<(poVar11,(string *)&local_1d0);
      std::operator<<(poVar11,'\"');
      std::__cxx11::string::~string((string *)&local_1d0);
      break;
    case TYPE_BOOL:
      iVar7 = t_const_value::get_integer((t_const_value *)out._368_8_);
      pcVar1 = "framed = False";
      if (0 < iVar7) {
        pcVar1 = "framed = True";
      }
      std::operator<<((ostream *)local_1a0,pcVar1 + 9);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
    case TYPE_I64:
      iVar7 = t_const_value::get_integer((t_const_value *)out._368_8_);
      std::ostream::operator<<(local_1a0,iVar7);
      break;
    case TYPE_DOUBLE:
      tVar5 = t_const_value::get_type((t_const_value *)out._368_8_);
      if (tVar5 == CV_INTEGER) {
        poVar11 = std::operator<<((ostream *)local_1a0,"float(");
        iVar7 = t_const_value::get_integer((t_const_value *)out._368_8_);
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,iVar7);
        std::operator<<(poVar11,")");
      }
      else {
        value_00 = t_const_value::get_double((t_const_value *)out._368_8_);
        t_generator::emit_double_as_string_abi_cxx11_(&local_1f0,&this->super_t_generator,value_00);
        std::operator<<((ostream *)local_1a0,(string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      break;
    default:
      local_211 = 1;
      auVar14 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_210,(t_base_type *)(ulong)local_1b0,auVar14._8_4_);
      std::operator+(auVar14._0_8_,"compiler error: no const of base type ",&local_210);
      local_211 = 0;
      __cxa_throw(auVar14._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string t_py_generator::render_const_value(t_type* type, t_const_value* value) {
  type = get_true_type(type);
  std::ostringstream out;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      if (((t_base_type*)type)->is_binary()) {
        out << 'b';
      }
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "True" : "False");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << "float(" << value->get_integer() << ")";
      } else {
        out << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type_name(type) << "(**{" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      indent(out) << render_const_value(g_type_string, v_iter->first) << ": "
          << render_const_value(field_type, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "})";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    if (is_immutable(type)) {
      out << "TFrozenDict(";
    }
    out << "{" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(ktype, v_iter->first) << ": "
          << render_const_value(vtype, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "}";
    if (is_immutable(type)) {
      out << ")";
    }
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    if (type->is_set()) {
      if (is_immutable(type)) {
        out << "frozen";
      }
      out << "set(";
    }
    if (is_immutable(type) || type->is_set()) {
      out << "(" << endl;
    } else {
      out << "[" << endl;
    }
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(etype, *v_iter) << "," << endl;
    }
    indent_down();
    if (is_immutable(type) || type->is_set()) {
      indent(out) << ")";
    } else {
      indent(out) << "]";
    }
    if (type->is_set()) {
      out << ")";
    }
  } else {
    throw "CANNOT GENERATE CONSTANT FOR TYPE: " + type->get_name();
  }

  return out.str();
}